

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void expr_toreg(FuncState *fs,ExpDesc *e,BCReg reg)

{
  int iVar1;
  BCPos BVar2;
  BCPos BVar3;
  BCPos dtarget;
  
  expr_toreg_nobranch(fs,e,reg);
  if (e->k == VJMP) {
    jmp_append(fs,&e->t,(e->u).s.info);
  }
  BVar3 = e->f;
  if (e->t == BVar3) goto LAB_0012defe;
  iVar1 = jmp_novalue(fs,e->t);
  if (iVar1 == 0) {
    iVar1 = jmp_novalue(fs,BVar3);
    if (iVar1 != 0) goto LAB_0012de5d;
    dtarget = 0xffffffff;
    BVar3 = 0xffffffff;
  }
  else {
LAB_0012de5d:
    BVar2 = 0xffffffff;
    if (e->k != VJMP) {
      BVar2 = bcemit_jmp(fs);
    }
    BVar3 = bcemit_INS(fs,reg << 8 | 0x1002b);
    bcemit_INS(fs,fs->freereg << 8 | 0x80010058);
    dtarget = bcemit_INS(fs,reg << 8 | 0x2002b);
    fs->lasttarget = fs->pc;
    jmp_append(fs,&fs->jpc,BVar2);
  }
  BVar2 = fs->pc;
  fs->lasttarget = BVar2;
  jmp_patchval(fs,e->f,BVar2,reg,BVar3);
  jmp_patchval(fs,e->t,BVar2,reg,dtarget);
LAB_0012defe:
  e->f = 0xffffffff;
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  e->t = 0xffffffff;
  return;
}

Assistant:

static void expr_toreg(FuncState *fs, ExpDesc *e, BCReg reg)
{
  expr_toreg_nobranch(fs, e, reg);
  if (e->k == VJMP)
    jmp_append(fs, &e->t, e->u.s.info);  /* Add it to the true jump list. */
  if (expr_hasjump(e)) {  /* Discharge expression with branches. */
    BCPos jend, jfalse = NO_JMP, jtrue = NO_JMP;
    if (jmp_novalue(fs, e->t) || jmp_novalue(fs, e->f)) {
      BCPos jval = (e->k == VJMP) ? NO_JMP : bcemit_jmp(fs);
      jfalse = bcemit_AD(fs, BC_KPRI, reg, VKFALSE);
      bcemit_AJ(fs, BC_JMP, fs->freereg, 1);
      jtrue = bcemit_AD(fs, BC_KPRI, reg, VKTRUE);
      jmp_tohere(fs, jval);
    }
    jend = fs->pc;
    fs->lasttarget = jend;
    jmp_patchval(fs, e->f, jend, reg, jfalse);
    jmp_patchval(fs, e->t, jend, reg, jtrue);
  }
  e->f = e->t = NO_JMP;
  e->u.s.info = reg;
  e->k = VNONRELOC;
}